

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

string<unsigned_short> __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::replaceSpecialCharacters
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,string<unsigned_short> *origstr)

{
  bool bVar1;
  _func_int **pp_Var2;
  ulong uVar3;
  unsigned_short *puVar4;
  int iVar5;
  uint uVar6;
  string<unsigned_short> *in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  string<unsigned_short> *psVar11;
  string<unsigned_short> sVar12;
  string<unsigned_short> *newstr;
  string<unsigned_short> local_60;
  string<unsigned_short> *local_50;
  string<unsigned_short> *local_48;
  int local_3c;
  ulong local_38;
  
  uVar8 = 0xffffffff;
  if (0 < (long)in_RDX->used) {
    uVar3 = 0;
    do {
      if (in_RDX->array[uVar3] == 0x26) {
        uVar8 = uVar3 & 0xffffffff;
        break;
      }
      uVar3 = uVar3 + 1;
    } while ((long)in_RDX->used != uVar3);
  }
  if ((int)uVar8 == -1) {
    (this->super_IIrrXMLReader<unsigned_short,_irr::io::IXMLBase>)._vptr_IIrrXMLReader =
         (_func_int **)0x0;
    this->TextData = (unsigned_short *)0x0;
    core::string<unsigned_short>::operator=((string<unsigned_short> *)this,in_RDX);
    uVar3 = extraout_RDX_01;
  }
  else {
    (this->super_IIrrXMLReader<unsigned_short,_irr::io::IXMLBase>)._vptr_IIrrXMLReader =
         (_func_int **)0x0;
    this->TextData = (unsigned_short *)0x100000001;
    pp_Var2 = (_func_int **)operator_new__(2);
    (this->super_IIrrXMLReader<unsigned_short,_irr::io::IXMLBase>)._vptr_IIrrXMLReader = pp_Var2;
    *(undefined2 *)pp_Var2 = 0;
    uVar3 = 0;
    psVar11 = origstr;
    local_50 = origstr;
    local_48 = in_RDX;
    do {
      iVar7 = (int)uVar8;
      if (in_RDX->used + -3 <= iVar7) break;
      local_3c = iVar7;
      local_38 = uVar3;
      if (*(int *)((long)&psVar11[6].array + 4) < 1) {
        uVar6 = 0xffffffff;
      }
      else {
        lVar9 = 0;
        lVar10 = 0;
        do {
          bVar1 = equalsn((CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *)origstr,
                          (unsigned_short *)(*(long *)(*(long *)&origstr[5].allocated + lVar9) + 2),
                          local_48->array + (long)iVar7 + 1,
                          *(int *)(*(long *)&origstr[5].allocated + 0xc + lVar9) + -2);
          uVar6 = (uint)lVar10;
          if (bVar1) break;
          lVar10 = lVar10 + 1;
          lVar9 = lVar9 + 0x10;
          uVar6 = 0xffffffff;
        } while (lVar10 < *(int *)((long)&origstr[6].array + 4));
      }
      iVar7 = local_3c;
      in_RDX = local_48;
      if (uVar6 == 0xffffffff) {
        core::string<unsigned_short>::subString(&local_60,(s32)local_48,(s32)local_38);
        psVar11 = local_50;
        core::string<unsigned_short>::append((string<unsigned_short> *)this,&local_60);
        if (local_60.array != (unsigned_short *)0x0) {
          operator_delete__(local_60.array);
        }
        iVar5 = 1;
      }
      else {
        core::string<unsigned_short>::subString(&local_60,(s32)local_48,(s32)local_38);
        psVar11 = local_50;
        core::string<unsigned_short>::append((string<unsigned_short> *)this,&local_60);
        if (local_60.array != (unsigned_short *)0x0) {
          operator_delete__(local_60.array);
        }
        core::string<unsigned_short>::append
                  ((string<unsigned_short> *)this,
                   **(unsigned_short **)(*(long *)&psVar11[5].allocated + (ulong)uVar6 * 0x10));
        iVar5 = *(int *)(*(long *)&psVar11[5].allocated + 0xc + (ulong)uVar6 * 0x10) + -1;
      }
      uVar6 = iVar5 + iVar7;
      uVar3 = (ulong)uVar6;
      uVar8 = 0xffffffff;
      if ((int)uVar6 < in_RDX->used) {
        puVar4 = in_RDX->array + (int)uVar6;
        do {
          if (*puVar4 == 0x26) {
            uVar8 = (ulong)uVar6;
            break;
          }
          uVar6 = uVar6 + 1;
          puVar4 = puVar4 + 1;
        } while (in_RDX->used != uVar6);
      }
    } while ((int)uVar8 != -1);
    if ((s32)uVar3 < in_RDX->used + -2) {
      core::string<unsigned_short>::subString(&local_60,(s32)in_RDX,(s32)uVar3);
      core::string<unsigned_short>::append((string<unsigned_short> *)this,&local_60);
      uVar3 = extraout_RDX;
      if (local_60.array != (unsigned_short *)0x0) {
        operator_delete__(local_60.array);
        uVar3 = extraout_RDX_00;
      }
    }
  }
  sVar12.allocated = (int)uVar3;
  sVar12.used = (int)(uVar3 >> 0x20);
  sVar12.array = (unsigned_short *)this;
  return sVar12;
}

Assistant:

core::string<char_type> replaceSpecialCharacters(
		core::string<char_type>& origstr)
	{
		int pos = origstr.findFirst(L'&');
		int oldPos = 0;

		if (pos == -1)
			return origstr;

		core::string<char_type> newstr;

		while(pos != -1 && pos < origstr.size()-2)
		{
			// check if it is one of the special characters

			int specialChar = -1;
			for (int i=0; i<(int)SpecialCharacters.size(); ++i)
			{
				const char_type* p = &origstr.c_str()[pos]+1;

				if (equalsn(&SpecialCharacters[i][1], p, SpecialCharacters[i].size()-1))
				{
					specialChar = i;
					break;
				}
			}

			if (specialChar != -1)
			{
				newstr.append(origstr.subString(oldPos, pos - oldPos));
				newstr.append(SpecialCharacters[specialChar][0]);
				pos += SpecialCharacters[specialChar].size();
			}
			else
			{
				newstr.append(origstr.subString(oldPos, pos - oldPos + 1));
				pos += 1;
			}

			// find next &
			oldPos = pos;
			pos = origstr.findNext(L'&', pos);		
		}

		if (oldPos < origstr.size()-1)
			newstr.append(origstr.subString(oldPos, origstr.size()-oldPos));

		return newstr;
	}